

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void round_shift_32_8xn_avx2(__m256i *in,int size,int bit,int stride)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  uint uVar4;
  int in_ECX;
  uint in_EDX;
  int in_ESI;
  long in_RDI;
  undefined1 auVar5 [16];
  int i_1;
  int i;
  __m256i round;
  undefined4 local_188;
  undefined4 local_184;
  undefined1 local_158;
  undefined8 uStack_70;
  undefined8 uStack_68;
  
  if ((int)in_EDX < 0) {
    local_158 = (char)-in_EDX;
    uVar4 = 1 << (local_158 - 1U & 0x1f);
    auVar1 = vpinsrd_avx(ZEXT416(uVar4),uVar4,1);
    auVar1 = vpinsrd_avx(auVar1,uVar4,2);
    auVar1 = vpinsrd_avx(auVar1,uVar4,3);
    auVar2 = vpinsrd_avx(ZEXT416(uVar4),uVar4,1);
    auVar2 = vpinsrd_avx(auVar2,uVar4,2);
    auVar2 = vpinsrd_avx(auVar2,uVar4,3);
    auVar5 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
    uStack_70 = auVar5._0_8_;
    uStack_68 = auVar5._8_8_;
    for (local_184 = 0; local_184 < in_ESI; local_184 = local_184 + 1) {
      auVar3._16_8_ = uStack_70;
      auVar3._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
      auVar3._24_8_ = uStack_68;
      auVar3 = vpaddd_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * local_184) * 0x20),auVar3
                          );
      *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * local_184) * 0x20) = auVar3;
      auVar3 = vpsrad_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * local_184) * 0x20),
                           ZEXT416(-in_EDX));
      *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * local_184) * 0x20) = auVar3;
    }
  }
  else if (0 < (int)in_EDX) {
    for (local_188 = 0; local_188 < in_ESI; local_188 = local_188 + 1) {
      auVar3 = vpslld_avx2(*(undefined1 (*) [32])(in_RDI + (long)(in_ECX * local_188) * 0x20),
                           ZEXT416(in_EDX));
      *(undefined1 (*) [32])(in_RDI + (long)(in_ECX * local_188) * 0x20) = auVar3;
    }
  }
  return;
}

Assistant:

static inline void round_shift_32_8xn_avx2(__m256i *in, int size, int bit,
                                           int stride) {
  if (bit < 0) {
    bit = -bit;
    __m256i round = _mm256_set1_epi32(1 << (bit - 1));
    for (int i = 0; i < size; ++i) {
      in[stride * i] = _mm256_add_epi32(in[stride * i], round);
      in[stride * i] = _mm256_srai_epi32(in[stride * i], bit);
    }
  } else if (bit > 0) {
    for (int i = 0; i < size; ++i) {
      in[stride * i] = _mm256_slli_epi32(in[stride * i], bit);
    }
  }
}